

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

int absl::lts_20250127::crc_internal::CRCImpl::FillZeroesTable(uint32_t poly,Uint32By256 *t)

{
  char *absl_raw_log_internal_basename;
  int a;
  uint32_t v;
  uint64_t inc_len;
  int local_20;
  int j;
  int i;
  uint32_t inc;
  Uint32By256 *t_local;
  uint32_t poly_local;
  
  j = 0x40000000;
  _i = t;
  t_local._4_4_ = poly;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    crc_internal::anon_unknown_0::PolyMultiply((uint32_t *)&j,j,t_local._4_4_);
  }
  inc_len._4_4_ = 0;
  for (_a = 1; _a != 0; _a = _a << 4) {
    absl_raw_log_internal_basename._4_4_ = j;
    for (absl_raw_log_internal_basename._0_4_ = 1; (int)absl_raw_log_internal_basename != 0x10;
        absl_raw_log_internal_basename._0_4_ = (int)absl_raw_log_internal_basename + 1) {
      (*_i)[inc_len._4_4_] = absl_raw_log_internal_basename._4_4_;
      crc_internal::anon_unknown_0::PolyMultiply
                ((uint32_t *)((long)&absl_raw_log_internal_basename + 4),j,t_local._4_4_);
      inc_len._4_4_ = inc_len._4_4_ + 1;
    }
    j = absl_raw_log_internal_basename._4_4_;
  }
  if (inc_len._4_4_ < 0x101) {
    return inc_len._4_4_;
  }
  raw_log_internal::RawLog(kFatal,"crc.cc",0xa0,"Check %s failed: %s","j <= 256","");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/crc/internal/crc.cc"
                ,0xa0,
                "static int absl::crc_internal::CRCImpl::FillZeroesTable(uint32_t, Uint32By256 *)");
}

Assistant:

int CRCImpl::FillZeroesTable(uint32_t poly, Uint32By256* t) {
  uint32_t inc = 1;
  inc <<= 31;

  // Extend by one zero bit. We know degree > 1 so (inc & 1) == 0.
  inc >>= 1;

  // Now extend by 2, 4, and 8 bits, so now `inc` is extended by one zero byte.
  for (int i = 0; i < 3; ++i) {
    PolyMultiply(&inc, inc, poly);
  }

  int j = 0;
  for (uint64_t inc_len = 1; inc_len != 0; inc_len <<= ZEROES_BASE_LG) {
    // Every entry in the table adds an additional inc_len zeroes.
    uint32_t v = inc;
    for (int a = 1; a != ZEROES_BASE; a++) {
      t[0][j] = v;
      PolyMultiply(&v, inc, poly);
      j++;
    }
    inc = v;
  }
  ABSL_RAW_CHECK(j <= 256, "");
  return j;
}